

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::BlockMultiBasicTypesCase::init
          (BlockMultiBasicTypesCase *this,EVP_PKEY_CTX *ctx)

{
  BufferBlock *pBVar1;
  BlockMultiBasicTypesCase *extraout_RAX;
  VarType local_298;
  BufferVar local_280;
  VarType local_240;
  BufferVar local_228;
  VarType local_1e8;
  BufferVar local_1d0;
  VarType local_190;
  BufferVar local_178;
  BufferBlock *local_138;
  BufferBlock *blockB;
  BufferVar local_118;
  VarType local_d8;
  BufferVar local_c0;
  VarType local_70;
  BufferVar local_58;
  BufferBlock *local_18;
  BufferBlock *blockA;
  BlockMultiBasicTypesCase *this_local;
  
  blockA = (BufferBlock *)this;
  pBVar1 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"BlockA");
  local_18 = pBVar1;
  glu::VarType::VarType(&local_70,TYPE_FLOAT,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_58,"a",&local_70,0x1800);
  bb::BufferBlock::addMember(pBVar1,&local_58);
  bb::BufferVar::~BufferVar(&local_58);
  glu::VarType::~VarType(&local_70);
  pBVar1 = local_18;
  glu::VarType::VarType(&local_d8,TYPE_UINT_VEC3,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_c0,"b",&local_d8,0);
  bb::BufferBlock::addMember(pBVar1,&local_c0);
  bb::BufferVar::~BufferVar(&local_c0);
  glu::VarType::~VarType(&local_d8);
  pBVar1 = local_18;
  glu::VarType::VarType((VarType *)&blockB,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_118,"c",(VarType *)&blockB,0x800);
  bb::BufferBlock::addMember(pBVar1,&local_118);
  bb::BufferVar::~BufferVar(&local_118);
  glu::VarType::~VarType((VarType *)&blockB);
  bb::BufferBlock::setInstanceName(local_18,"blockA");
  bb::BufferBlock::setFlags(local_18,this->m_flagsA);
  pBVar1 = bb::ShaderInterface::allocBlock(&(this->super_SSBOLayoutCase).m_interface,"BlockB");
  local_138 = pBVar1;
  glu::VarType::VarType(&local_190,TYPE_FLOAT_MAT3,PRECISION_MEDIUMP);
  bb::BufferVar::BufferVar(&local_178,"a",&local_190,0x1000);
  bb::BufferBlock::addMember(pBVar1,&local_178);
  bb::BufferVar::~BufferVar(&local_178);
  glu::VarType::~VarType(&local_190);
  pBVar1 = local_138;
  glu::VarType::VarType(&local_1e8,TYPE_INT_VEC2,PRECISION_LOWP);
  bb::BufferVar::BufferVar(&local_1d0,"b",&local_1e8,0x800);
  bb::BufferBlock::addMember(pBVar1,&local_1d0);
  bb::BufferVar::~BufferVar(&local_1d0);
  glu::VarType::~VarType(&local_1e8);
  pBVar1 = local_138;
  glu::VarType::VarType(&local_240,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  bb::BufferVar::BufferVar(&local_228,"c",&local_240,0);
  bb::BufferBlock::addMember(pBVar1,&local_228);
  bb::BufferVar::~BufferVar(&local_228);
  glu::VarType::~VarType(&local_240);
  pBVar1 = local_138;
  glu::VarType::VarType(&local_298,TYPE_BOOL,PRECISION_LAST);
  bb::BufferVar::BufferVar(&local_280,"d",&local_298,0x1800);
  bb::BufferBlock::addMember(pBVar1,&local_280);
  bb::BufferVar::~BufferVar(&local_280);
  glu::VarType::~VarType(&local_298);
  bb::BufferBlock::setInstanceName(local_138,"blockB");
  bb::BufferBlock::setFlags(local_138,this->m_flagsB);
  if (0 < this->m_numInstances) {
    bb::BufferBlock::setArraySize(local_18,this->m_numInstances);
    bb::BufferBlock::setArraySize(local_138,this->m_numInstances);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

void init (void)
	{
		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_READ));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(glu::TYPE_INT_VEC2, glu::PRECISION_LOWP), ACCESS_READ));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}
	}